

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

long unpaid_cost(obj *unp_obj)

{
  monst *shkp;
  bill_x *pbVar1;
  
  shkp = next_shkp(level->monlist,'\x01');
  while( true ) {
    if (shkp == (monst *)0x0) {
      warning("unpaid_cost: object wasn\'t on any bill!");
      return 0;
    }
    pbVar1 = onbill(unp_obj,shkp,'\x01');
    if (pbVar1 != (bill_x *)0x0) break;
    shkp = next_shkp(shkp->nmon,'\x01');
  }
  return (long)pbVar1->price * (long)unp_obj->quan;
}

Assistant:

long unpaid_cost(const struct obj *unp_obj)
{
	struct bill_x *bp = NULL;
	struct monst *shkp;

	for (shkp = next_shkp(level->monlist, TRUE); shkp;
					shkp = next_shkp(shkp->nmon, TRUE))
	    if ((bp = onbill(unp_obj, shkp, TRUE)) != 0) break;

	/* onbill() gave no message if unexpected problem occurred */
	if (!bp) warning("unpaid_cost: object wasn't on any bill!");

	return bp ? unp_obj->quan * bp->price : 0L;
}